

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O3

int __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::CalculateHasBits(FieldGeneratorMap *this)

{
  __uniq_ptr_impl<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
  _Var1;
  char cVar2;
  int iVar3;
  int has_index;
  long lVar4;
  
  if (*(int *)(this->descriptor_ + 4) < 1) {
    has_index = 0;
  }
  else {
    lVar4 = 0;
    has_index = 0;
    do {
      cVar2 = (**(code **)(*(long *)(this->field_generators_).
                                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t.
                                    super___uniq_ptr_impl<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                                    ._M_t + 0x48))();
      _Var1._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>.
      _M_head_impl = (this->field_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                     ._M_t;
      if (cVar2 == '\0') {
        FieldGenerator::SetNoHasBit
                  ((FieldGenerator *)
                   _Var1._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>
                   ._M_head_impl);
      }
      else {
        FieldGenerator::SetRuntimeHasBit
                  ((FieldGenerator *)
                   _Var1._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>
                   ._M_head_impl,has_index);
        has_index = has_index + 1;
      }
      iVar3 = (**(code **)(*(long *)(this->field_generators_).
                                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t.
                                    super___uniq_ptr_impl<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                                    ._M_t + 0x50))();
      if (iVar3 != 0) {
        _Var1._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>.
        _M_head_impl = (this->field_generators_).
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t.
                       super___uniq_ptr_impl<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                       ._M_t;
        (**(code **)(*(long *)_Var1._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>
                              ._M_head_impl + 0x58))
                  (_Var1._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::objectivec::FieldGenerator_*,_false>
                   ._M_head_impl,has_index);
        has_index = has_index + iVar3;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(int *)(this->descriptor_ + 4));
  }
  return has_index;
}

Assistant:

int FieldGeneratorMap::CalculateHasBits(void) {
  int total_bits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (field_generators_[i]->RuntimeUsesHasBit()) {
      field_generators_[i]->SetRuntimeHasBit(total_bits);
      ++total_bits;
    } else {
      field_generators_[i]->SetNoHasBit();
    }
    int extra_bits = field_generators_[i]->ExtraRuntimeHasBitsNeeded();
    if (extra_bits) {
      field_generators_[i]->SetExtraRuntimeHasBitsBase(total_bits);
      total_bits += extra_bits;
    }
  }
  return total_bits;
}